

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

_anonymous_namespace_ * __thiscall
ctemplate::(anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
          (_anonymous_namespace_ *this,
          vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals
          )

{
  bool bVar1;
  reference modval;
  ctemplate local_50 [8];
  string one_mod;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_30;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_28;
  const_iterator it;
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals_local;
  string *out;
  
  it._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  local_28._M_current =
       (ModifierAndValue *)
       std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::begin
                 (modvals);
  while( true ) {
    local_30._M_current =
         (ModifierAndValue *)
         std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::end
                   (modvals);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    modval = __gnu_cxx::
             __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
             ::operator*(&local_28);
    PrettyPrintOneModifier_abi_cxx11_(local_50,modval);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_50);
    __gnu_cxx::
    __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
    ::operator++(&local_28);
  }
  return this;
}

Assistant:

static string PrettyPrintTokenModifiers(
    const vector<ModifierAndValue>& modvals) {
  string out;
  for (vector<ModifierAndValue>::const_iterator it =
           modvals.begin(); it != modvals.end();  ++it) {
    string one_mod = PrettyPrintOneModifier(*it);
    out.append(one_mod);
  }
  return out;
}